

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O0

void __thiscall QSliderPrivate::resetLayoutItemMargins(QSliderPrivate *this)

{
  long lVar1;
  QSlider *pQVar2;
  QSliderPrivate *in_RDI;
  long in_FS_OFFSET;
  QSlider *q;
  QStyleOptionSlider opt;
  QStyleOption *opt_00;
  SubElement element;
  QWidgetPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  this_00 = (QWidgetPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt_00 = (QStyleOption *)&DAT_aaaaaaaaaaaaaaaa;
  element = 0xaaaaaaaa;
  QStyleOptionSlider::QStyleOptionSlider((QStyleOptionSlider *)0x6823b9);
  (**(code **)(*(long *)&(pQVar2->super_QAbstractSlider).super_QWidget + 0x1a8))
            (pQVar2,&stack0xffffffffffffff78);
  QWidgetPrivate::setLayoutItemMargins(this_00,element,opt_00);
  QStyleOptionSlider::~QStyleOptionSlider((QStyleOptionSlider *)0x6823ec);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSliderPrivate::resetLayoutItemMargins()
{
    Q_Q(QSlider);
    QStyleOptionSlider opt;
    // ### This is (also) reached from the ctor which is unfortunate since a possible
    // ### re-implementation of initStyleOption is then not called.
    q->initStyleOption(&opt);
    setLayoutItemMargins(QStyle::SE_SliderLayoutItem, &opt);
}